

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pipe_pinger_new(int vectored_writes)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  pinger_t *pinger;
  int r;
  int vectored_writes_local;
  
  piVar2 = (int *)malloc(0x168);
  if (piVar2 == (int *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x11b,"pinger","!=","NULL",0,"!=",0);
    abort();
  }
  *piVar2 = vectored_writes;
  piVar2[2] = 0;
  piVar2[1] = 0;
  *(char **)(piVar2 + 0x58) = PING;
  uVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar3,piVar2 + 4,0);
  *(int **)(piVar2 + 4) = piVar2;
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x124,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_pipe_connect(piVar2 + 0x3e,piVar2 + 4,"/tmp/uv-test-sock",pinger_on_connect);
  if ((long)pinger_on_connect_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,300,"pinger_on_connect_count","==","0",(long)pinger_on_connect_count,"==",0);
    abort();
  }
  return;
}

Assistant:

static void pipe_pinger_new(int vectored_writes) {
  int r;
  pinger_t* pinger;

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0);
  pinger->stream.pipe.data = pinger;
  ASSERT_OK(r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  uv_pipe_connect(&pinger->connect_req, &pinger->stream.pipe, TEST_PIPENAME,
      pinger_on_connect);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT_OK(pinger_on_connect_count);
}